

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

bool __thiscall helics::InputInfo::updateData(InputInfo *this,dataRecord *update,int index)

{
  bool bVar1;
  __shared_ptr *this_00;
  reference pvVar2;
  int in_EDX;
  TimeRepresentation<count_time<9,_long>_> *in_RSI;
  SmallBuffer *in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar3;
  __shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffa0;
  shared_ptr<const_helics::SmallBuffer> *this_01;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffc0;
  pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int> local_30;
  int local_1c;
  TimeRepresentation<count_time<9,_long>_> *local_18;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  if ((in_RDI[1].buffer._M_elems[0xb] & 1) != 0) {
    this_00 = (__shared_ptr *)
              std::
              vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
              ::operator[]((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                            *)(in_RDI[1].buffer._M_elems + 0x38),(long)in_EDX);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      std::
      vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
      ::operator[]((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                    *)(in_RDI[1].buffer._M_elems + 0x38),(long)local_1c);
      std::__shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*(in_stack_ffffffffffffffa0);
      std::__shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*(in_stack_ffffffffffffffa0);
      bVar1 = helics::operator!=((SmallBuffer *)in_stack_ffffffffffffffc0.internalTimeCode,in_RDI);
      if (!bVar1) {
        pvVar2 = std::
                 vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                 ::operator[]((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                               *)(in_RDI[1].buffer._M_elems + 0x20),(long)local_1c);
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar2->first,local_18);
        if (bVar1) {
          uVar3 = (uint)local_18[1].internalTimeCode;
          pvVar2 = std::
                   vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                                 *)(in_RDI[1].buffer._M_elems + 0x20),(long)local_1c);
          pvVar2->second = uVar3;
        }
        return false;
      }
      this_01 = (shared_ptr<const_helics::SmallBuffer> *)(local_18 + 2);
      std::
      vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
      ::operator[]((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                    *)(in_RDI[1].buffer._M_elems + 0x38),(long)local_1c);
      std::shared_ptr<const_helics::SmallBuffer>::operator=
                (this_01,(shared_ptr<const_helics::SmallBuffer> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>::
      pair<TimeRepresentation<count_time<9,_long>_>_&,_unsigned_int_&,_true>
                ((pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int> *)
                 &stack0xffffffffffffffc0,local_18,(uint *)(local_18 + 1));
      pvVar2 = std::
               vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                             *)(in_RDI[1].buffer._M_elems + 0x20),(long)local_1c);
      std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>::operator=
                (pvVar2,(type)&stack0xffffffffffffffc0);
      return true;
    }
  }
  std::
  vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
  ::operator[]((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                *)(in_RDI[1].buffer._M_elems + 0x38),(long)local_1c);
  std::shared_ptr<const_helics::SmallBuffer>::operator=
            ((shared_ptr<const_helics::SmallBuffer> *)in_stack_ffffffffffffffa0,
             (shared_ptr<const_helics::SmallBuffer> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>::
  pair<TimeRepresentation<count_time<9,_long>_>_&,_unsigned_int_&,_true>
            (&local_30,local_18,(uint *)(local_18 + 1));
  pvVar2 = std::
           vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
           ::operator[]((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                         *)(in_RDI[1].buffer._M_elems + 0x20),(long)local_1c);
  std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>::operator=(pvVar2,&local_30);
  return true;
}

Assistant:

bool InputInfo::updateData(dataRecord&& update, int index)
{
    if (!only_update_on_change || !current_data[index]) {
        current_data[index] = std::move(update.data);
        current_data_time[index] = {update.time, update.iteration};
        return true;
    }

    if (*current_data[index] != *(update.data)) {
        current_data[index] = std::move(update.data);
        current_data_time[index] = {update.time, update.iteration};
        return true;
    }
    if (current_data_time[index].first == update.time) {
        // this is for bookkeeping purposes should still return false
        current_data_time[index].second = update.iteration;
    }
    return false;
}